

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportBuildFileGenerator *this,string *name,string *config)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string fileName;
  string cxx_modules_dirname;
  string se;
  ostringstream e;
  cmGeneratedFileStream os;
  string local_4a8;
  long *local_488;
  long local_480;
  long local_478 [2];
  string local_468;
  undefined1 **local_448;
  long local_440;
  undefined1 *local_438;
  undefined1 local_430 [32];
  undefined1 local_410 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400 [6];
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  undefined8 local_280;
  char *local_278;
  undefined8 local_270;
  long *local_260;
  undefined8 local_258;
  undefined8 local_250;
  char *local_248;
  undefined8 local_240;
  size_type local_238;
  pointer local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined1 *local_218;
  undefined8 local_210;
  size_type local_208;
  pointer local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])(&local_488);
  if (local_480 == 0) {
    bVar5 = true;
  }
  else {
    local_208 = config->_M_string_length;
    if (local_208 == 0) {
      std::__cxx11::string::_M_replace((ulong)config,0,(char *)0x0,0x93e912);
      local_208 = config->_M_string_length;
    }
    local_298._8_8_ = (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    local_298._0_8_ = (this->super_cmExportFileGenerator).FileDir._M_string_length;
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_400[0]._0_8_ = local_400[0]._M_local_buf + 8;
    local_410._0_8_ = (_func_int **)0x0;
    local_410._8_8_ = 1;
    local_400[0]._M_local_buf[8] = '/';
    local_280 = 1;
    local_270 = 0;
    local_260 = local_488;
    local_258 = 0;
    local_250 = 0xd;
    local_248 = "/cxx-modules-";
    local_240 = 0;
    local_230 = (name->_M_dataplus)._M_p;
    local_238 = name->_M_string_length;
    local_228 = 0;
    local_438 = local_430;
    local_448 = (undefined1 **)0x0;
    local_440 = 1;
    local_430[0] = 0x2d;
    local_220 = 1;
    local_210 = 0;
    local_200 = (config->_M_dataplus)._M_p;
    local_1f8 = 0;
    local_1f0 = 6;
    local_1e8 = ".cmake";
    local_1e0 = 0;
    views._M_len = 8;
    views._M_array = (iterator)local_298;
    local_278 = (char *)local_400[0]._0_8_;
    local_218 = local_438;
    cmCatViews(&local_4a8,views);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_4a8,true,None);
    bVar5 = (*(byte *)((long)&local_278 + (long)*(_func_int **)(local_298._0_8_ + -0x18)) & 5) == 0;
    if (bVar5) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
      p_Var3 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      p_Var4 = &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var3 != p_Var4) {
        do {
          this_00 = *(cmGeneratorTarget **)(p_Var3 + 1);
          bVar1 = cmGeneratorTarget::HaveCxx20ModuleSources(this_00,(string *)0x0);
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"include(\"${CMAKE_CURRENT_LIST_DIR}/target-",0x2a);
            cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_410,this_00);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_298,(char *)local_410._0_8_,local_410._8_8_);
            local_448 = (undefined1 **)CONCAT71(local_448._1_7_,0x2d);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_448,1)
            ;
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar2,(config->_M_dataplus)._M_p,config->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,".cmake\")\n",9);
            if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
              operator_delete((void *)local_410._0_8_,
                              (ulong)(local_400[0]._M_allocated_capacity + 1));
            }
          }
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        } while ((_Rb_tree_header *)p_Var3 != p_Var4);
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_410,"cannot write to file \"",0x16);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_410,local_4a8._M_dataplus._M_p,local_4a8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_448,local_440);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base(local_3a0);
      if (local_448 != &local_438) {
        operator_delete(local_448,(ulong)(local_438 + 1));
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_488 != local_478) {
    operator_delete(local_488,local_478[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion(
  std::string const& name, std::string config) const
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  if (config.empty()) {
    config = "noconfig";
  }

  std::string fileName =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, "/cxx-modules-", name,
             '-', config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  for (auto const* tgt : this->ExportedTargets) {
    // Only targets with C++ module sources will have a
    // collator-generated install script.
    if (!tgt->HaveCxx20ModuleSources()) {
      continue;
    }

    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/target-" << tgt->GetExportName()
       << '-' << config << ".cmake\")\n";
  }

  return true;
}